

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopIsOneRow(WhereLoop *pLoop)

{
  int ii;
  WhereLoop *pLoop_local;
  int local_4;
  
  if (((((pLoop->u).btree.pIndex)->onError == '\0') || (pLoop->nSkip != 0)) ||
     ((pLoop->u).btree.nEq != ((pLoop->u).btree.pIndex)->nKeyCol)) {
    local_4 = 0;
  }
  else {
    for (ii = 0; ii < (int)(uint)(pLoop->u).btree.nEq; ii = ii + 1) {
      if ((pLoop->aLTerm[ii]->eOperator & 0x180) != 0) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int whereLoopIsOneRow(WhereLoop *pLoop){
  if( pLoop->u.btree.pIndex->onError
   && pLoop->nSkip==0
   && pLoop->u.btree.nEq==pLoop->u.btree.pIndex->nKeyCol
  ){
    int ii;
    for(ii=0; ii<pLoop->u.btree.nEq; ii++){
      if( pLoop->aLTerm[ii]->eOperator & (WO_IS|WO_ISNULL) ){
        return 0;
      }
    }
    return 1;
  }
  return 0;
}